

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
::ShadedRenderer(ShadedRenderer<ImPlot::GetterYs<unsigned_long_long>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
                 *this,GetterYs<unsigned_long_long> *getter1,GetterYRef *getter2,
                TransformerLinLin *transformer,ImU32 col)

{
  unsigned_long_long uVar1;
  ImVec2 IVar2;
  int iVar3;
  ImVec2 IVar4;
  ImPlotContext *pIVar5;
  int iVar6;
  ImPlotContext *gp;
  ImVec2 IVar7;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar3 = getter1->Count;
  iVar6 = getter2->Count;
  if (iVar3 < getter2->Count) {
    iVar6 = iVar3;
  }
  this->Prims = iVar6 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar5 = GImPlot;
  (this->P12).y = 0.0;
  uVar1 = *(unsigned_long_long *)
           ((long)getter1->Ys +
           (long)((getter1->Offset % iVar3 + iVar3) % iVar3) * (long)getter1->Stride);
  iVar3 = transformer->YAxis;
  IVar2 = GImPlot->PixelRange[iVar3].Min;
  IVar7.x = (float)(GImPlot->Mx *
                    ((getter1->XScale * 0.0 + getter1->X0) - (GImPlot->CurrentPlot->XAxis).Range.Min
                    ) + (double)IVar2.x);
  IVar7.y = (float)(GImPlot->My[iVar3] *
                    ((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) -
                    GImPlot->CurrentPlot->YAxis[iVar3].Range.Min) + (double)IVar2.y);
  this->P11 = IVar7;
  iVar3 = transformer->YAxis;
  IVar2 = pIVar5->PixelRange[iVar3].Min;
  IVar4.y = (float)(pIVar5->My[iVar3] *
                    (getter2->YRef - pIVar5->CurrentPlot->YAxis[iVar3].Range.Min) + (double)IVar2.y)
  ;
  IVar4.x = (float)(pIVar5->Mx *
                    ((getter2->XScale * 0.0 + getter2->X0) - (pIVar5->CurrentPlot->XAxis).Range.Min)
                   + (double)IVar2.x);
  this->P12 = IVar4;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }